

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::push
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t param_2,uint64_t offset,uint64_t size)

{
  in_memory *__args;
  bool local_4a;
  undefined1 local_49;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  uint64_t local_38;
  uint64_t local_30;
  shared_ptr<pstore::memory_mapper_base> local_28;
  
  local_38 = size;
  local_30 = offset;
  if (regions.ptr_ ==
      (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
       *)0x0) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0xa1);
  }
  if (this->minimum_size_ <= size) {
    __args = (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_4a = __args->writable_;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::in_memory_mapper,std::allocator<pstore::in_memory_mapper>,pstore::file::in_memory&,bool,unsigned_long&,unsigned_long&>
              (&_Stack_40,(in_memory_mapper **)&local_48,
               (allocator<pstore::in_memory_mapper> *)&local_49,__args,&local_4a,&local_30,&local_38
              );
    local_28.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    local_28.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_40._M_pi;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
    ::emplace_back<std::shared_ptr<pstore::memory_mapper_base>>
              ((vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
                *)regions.ptr_,&local_28);
    if (local_28.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    return;
  }
  assert_failed("size >= minimum_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xa2);
}

Assistant:

void
        region_builder<File, MemoryMapper>::push (gsl::not_null<container_type *> const regions,
                                                  std::uint64_t const /*file_size*/,
                                                  std::uint64_t offset, std::uint64_t size) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (size >= minimum_size_);
            // (Note that we separately make pages read-only to guard against writing to committed
            // transactions: that's done by database::protect() rather than here.)
            regions->push_back (
                std::make_shared<MemoryMapper> (*file_, file_->is_writable (), offset, size));
        }